

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void int_list_diff(int *a,int *b,int *c)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar1 = *b;
  do {
    if (iVar1 < 0) {
LAB_0014a785:
      *a = -1;
      return;
    }
    iVar1 = *c;
    while( true ) {
      if (iVar1 < 0) {
        iVar1 = *b;
        while (-1 < iVar1) {
          b = b + 1;
          *a = iVar1;
          a = a + 1;
          iVar1 = *b;
        }
        goto LAB_0014a785;
      }
      while( true ) {
        piVar3 = b + 1;
        iVar1 = *b;
        iVar2 = *c;
        if (iVar1 == iVar2) {
          c = c + 1;
          b = piVar3;
          goto LAB_0014a754;
        }
        if (iVar2 <= iVar1) break;
        *a = iVar1;
        a = a + 1;
        b = piVar3;
        if (*piVar3 < 0) goto LAB_0014a785;
      }
      if (iVar1 <= iVar2) break;
      iVar1 = c[1];
      c = c + 1;
    }
LAB_0014a754:
    iVar1 = *b;
  } while( true );
}

Assistant:

void int_list_diff(int *a, int *b, int *c) {
  while (1) {
    if (*b < 0) break;
  Lagainc:
    if (*c < 0) {
      while (*b >= 0) *a++ = *b++;
      break;
    }
  Lagainb:
    if (*b == *c) {
      b++;
      c++;
      continue;
    }
    if (*b < *c) {
      *a++ = *b++;
      if (*b < 0) break;
      goto Lagainb;
    }
    if (*c < *b) {
      c++;
      goto Lagainc;
    }
  }
  *a++ = -1;
}